

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

_Bool h2_permissible_field(dynhds_entry *e)

{
  int iVar1;
  ulong local_20;
  size_t i;
  dynhds_entry *e_local;
  
  local_20 = 0;
  while( true ) {
    if (5 < local_20) {
      return true;
    }
    if (e->namelen < H2_NON_FIELD[local_20].namelen) break;
    if ((e->namelen == H2_NON_FIELD[local_20].namelen) &&
       (iVar1 = curl_strequal(H2_NON_FIELD[local_20].name,e->name), iVar1 != 0)) {
      return false;
    }
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

static bool h2_permissible_field(struct dynhds_entry *e)
{
  size_t i;
  for(i = 0; i < CURL_ARRAYSIZE(H2_NON_FIELD); ++i) {
    if(e->namelen < H2_NON_FIELD[i].namelen)
      return TRUE;
    if(e->namelen == H2_NON_FIELD[i].namelen &&
       strcasecompare(H2_NON_FIELD[i].name, e->name))
      return FALSE;
  }
  return TRUE;
}